

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

int32_t characterIteratorMove(UCharIterator *iter,int32_t delta,UCharIteratorOrigin origin)

{
  long *plVar1;
  int32_t iVar2;
  UCharIteratorOrigin origin_local;
  int32_t delta_local;
  UCharIterator *iter_local;
  
  if (origin < UITER_ZERO) {
    iter_local._4_4_ = (**(code **)(*iter->context + 0xc0))(iter->context,delta,origin);
  }
  else if (origin == UITER_ZERO) {
    (**(code **)(*iter->context + 0x78))(iter->context,delta);
    iter_local._4_4_ = icu_63::CharacterIterator::getIndex((CharacterIterator *)iter->context);
  }
  else if (origin == UITER_LENGTH) {
    plVar1 = (long *)iter->context;
    iVar2 = icu_63::CharacterIterator::getLength((CharacterIterator *)iter->context);
    (**(code **)(*plVar1 + 0x78))(plVar1,iVar2 + delta);
    iter_local._4_4_ = icu_63::CharacterIterator::getIndex((CharacterIterator *)iter->context);
  }
  else {
    iter_local._4_4_ = -1;
  }
  return iter_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
characterIteratorMove(UCharIterator *iter, int32_t delta, UCharIteratorOrigin origin) {
    switch(origin) {
    case UITER_ZERO:
        ((CharacterIterator *)(iter->context))->setIndex(delta);
        return ((CharacterIterator *)(iter->context))->getIndex();
    case UITER_START:
    case UITER_CURRENT:
    case UITER_LIMIT:
        return ((CharacterIterator *)(iter->context))->move(delta, (CharacterIterator::EOrigin)origin);
    case UITER_LENGTH:
        ((CharacterIterator *)(iter->context))->setIndex(((CharacterIterator *)(iter->context))->getLength()+delta);
        return ((CharacterIterator *)(iter->context))->getIndex();
    default:
        /* not a valid origin */
        /* Should never get here! */
        return -1;
    }
}